

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  char cVar2;
  ImGuiTableColumn *pIVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  bool enabled;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    cVar2 = table->ContextPopupColumn;
    if (cVar2 < '\0') {
      iVar8 = -1;
    }
    else {
      iVar8 = -1;
      if ((int)cVar2 < table->ColumnsCount) {
        iVar8 = (int)cVar2;
      }
    }
    if (iVar8 == -1) {
      pIVar3 = (ImGuiTableColumn *)0x0;
    }
    else {
      pIVar3 = (table->Columns).Data + iVar8;
    }
    uVar6 = table->Flags & 1;
    cVar2 = (char)uVar6;
    if (uVar6 != 0) {
      if (pIVar3 != (ImGuiTableColumn *)0x0) {
        if ((pIVar3->Flags & 0x20) == 0) {
          bVar1 = pIVar3->IsEnabled;
        }
        else {
          bVar1 = false;
        }
        bVar1 = MenuItem("Size column to fit###SizeOne",(char *)0x0,false,bVar1);
        if (bVar1) {
          pIVar3 = (table->Columns).Data;
          if (pIVar3[iVar8].IsEnabled == true) {
            pIVar3[iVar8].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = (ImGuiTableColumnIdx)iVar8;
          }
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        pcVar7 = "Size all columns to fit###SizeAll";
      }
      else {
        pcVar7 = "Size all columns to default###SizeAll";
      }
      bVar1 = MenuItem(pcVar7,(char *)0x0,false,true);
      if ((bVar1) && (iVar8 = table->ColumnsCount, 0 < (long)iVar8)) {
        pIVar3 = (table->Columns).Data;
        lVar5 = 0;
        do {
          if (((&pIVar3->IsEnabled)[lVar5] != false) ||
             ((*(byte *)((long)&pIVar3->Flags + lVar5) & 8) != 0)) {
            *(undefined2 *)(&pIVar3->AutoFitQueue + lVar5) = 0x102;
          }
          lVar5 = lVar5 + 0x68;
        } while ((long)iVar8 * 0x68 - lVar5 != 0);
      }
    }
    if ((table->Flags & 2) != 0) {
      bVar1 = MenuItem("Reset order",(char *)0x0,false,(bool)(table->IsDefaultDisplayOrder ^ 1));
      cVar2 = '\x01';
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
    }
    if ((table->Flags & 4) != 0) {
      if (cVar2 != '\0') {
        Separator();
      }
      PushItemFlag(0x20,true);
      if (0 < table->ColumnsCount) {
        lVar5 = 0x5c;
        lVar9 = 0;
        do {
          pIVar3 = (table->Columns).Data;
          uVar6 = *(uint *)((long)pIVar3 + lVar5 + -0x5c);
          cVar2 = (char)uVar6;
          if ((uVar6 & 1) == 0) {
            if ((table->IsLayoutLocked != false) || (pcVar7 = "", lVar9 < table->DeclColumnsCount))
            {
              lVar4 = (long)*(short *)((long)pIVar3 + lVar5 + -0xc);
              pcVar7 = "";
              if (lVar4 != -1) {
                pcVar7 = (table->ColumnsNames).Buf.Data + lVar4;
              }
            }
            if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
              pcVar7 = "<Unknown>";
            }
            enabled = -1 < cVar2;
            bVar1 = *(bool *)((long)pIVar3 + lVar5 + -1);
            if (bVar1 == true) {
              enabled = '\x01' < table->ColumnsEnabledCount && -1 < cVar2;
            }
            bVar1 = MenuItem(pcVar7,(char *)0x0,bVar1,enabled);
            if (bVar1) {
              *(byte *)((long)&pIVar3->Flags + lVar5) = *(byte *)((long)pIVar3 + lVar5 + -1) ^ 1;
            }
          }
          lVar9 = lVar9 + 1;
          lVar5 = lVar5 + 0x68;
        } while (lVar9 < table->ColumnsCount);
      }
      PopItemFlag();
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem("Size column to fit###SizeOne", NULL, false, can_resize))
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = "Size all columns to fit###SizeAll";        // All fixed
        else
            size_all_desc = "Size all columns to default###SizeAll";    // All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem("Reset order", NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            if (other_column->Flags & ImGuiTableColumnFlags_Disabled)
                continue;

            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsUserEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsUserEnabled, menu_item_active))
                other_column->IsUserEnabledNextFrame = !other_column->IsUserEnabled;
        }
        PopItemFlag();
    }
}